

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptGeneratorFunction * __thiscall
Js::JavascriptLibrary::CreateGeneratorFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,
          GeneratorVirtualScriptFunction *scriptFunction)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  DynamicType *type;
  Recycler *this_00;
  JavascriptGeneratorFunction *this_01;
  DynamicTypeHandler *typeHandler;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (((((this->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
      m_ES6Generators == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x19ad,"(scriptContext->GetConfig()->IsES6GeneratorsEnabled())",
                                "scriptContext->GetConfig()->IsES6GeneratorsEnabled()");
    if (!bVar2) goto LAB_00c01dd7;
    *puVar5 = 0;
  }
  cVar3 = (**(code **)((long)(scriptFunction->super_ScriptFunction).super_ScriptFunctionBase.
                             super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x3b8))
                    (scriptFunction);
  if (cVar3 == '\0') {
    typeHandler = (DynamicTypeHandler *)
                  &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeGeneratorFunction,Js::InitializeFunctionDeferredTypeHandlerFilter<true,true,true>,false,(unsigned_short)0,(unsigned_short)0>
                   ::defaultInstance;
  }
  else {
    typeHandler = (DynamicTypeHandler *)
                  &DeferredTypeHandler<&Js::JavascriptLibrary::InitializeGeneratorFunction,Js::InitializeFunctionDeferredTypeHandlerFilter<false,true,true>,false,(unsigned_short)0,(unsigned_short)0>
                   ::defaultInstance;
  }
  type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                          &((this->super_JavascriptLibraryBase).generatorFunctionPrototype.ptr)->
                           super_RecyclableObject,entryPoint,typeHandler,false,false);
  local_50 = (undefined1  [8])&JavascriptGeneratorFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x19b1;
  this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00c01dd7;
    *puVar5 = 0;
  }
  this_01 = (JavascriptGeneratorFunction *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                      (this_00,0x38);
  if (this_01 == (JavascriptGeneratorFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa70,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00c01dd7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  JavascriptGeneratorFunction::JavascriptGeneratorFunction(this_01,type,scriptFunction);
  return this_01;
}

Assistant:

JavascriptGeneratorFunction* JavascriptLibrary::CreateGeneratorFunction(JavascriptMethod entryPoint, GeneratorVirtualScriptFunction* scriptFunction)
    {
        Assert(scriptContext->GetConfig()->IsES6GeneratorsEnabled());

        DynamicType* type = CreateDeferredPrototypeGeneratorFunctionType(entryPoint, scriptFunction->IsAnonymousFunction());

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptGeneratorFunction, type, scriptFunction);
    }